

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O2

void __thiscall cmDepends::SetIncludePathFromLanguage(cmDepends *this,string *lang)

{
  cmMakefile *this_00;
  cmValue cVar1;
  string_view arg;
  string includePathVar;
  string sStack_c8;
  string local_a8;
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  
  local_58.View_._M_len = 6;
  local_58.View_._M_str = "CMAKE_";
  local_88.View_._M_str = (lang->_M_dataplus)._M_p;
  local_88.View_._M_len = lang->_M_string_length;
  cmStrCat<char[21]>(&sStack_c8,&local_58,&local_88,(char (*) [21])"_TARGET_INCLUDE_PATH");
  this_00 = (this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  cVar1 = cmMakefile::GetDefinition(this_00,&sStack_c8);
  if (cVar1.Value == (string *)0x0) {
    local_58.View_._M_len = 6;
    local_58.View_._M_str = "CMAKE_";
    local_88.View_._M_str = (lang->_M_dataplus)._M_p;
    local_88.View_._M_len = lang->_M_string_length;
    cmStrCat<char[14]>(&local_a8,&local_58,&local_88,(char (*) [14])0x5f8c4e);
    std::__cxx11::string::operator=((string *)&sStack_c8,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    cVar1 = cmMakefile::GetDefinition(this_00,&sStack_c8);
    if (cVar1.Value == (string *)0x0) goto LAB_00402650;
  }
  arg._M_str = ((cVar1.Value)->_M_dataplus)._M_p;
  arg._M_len = (cVar1.Value)->_M_string_length;
  cmExpandList(arg,&this->IncludePath,false);
LAB_00402650:
  std::__cxx11::string::~string((string *)&sStack_c8);
  return;
}

Assistant:

void cmDepends::SetIncludePathFromLanguage(const std::string& lang)
{
  // Look for the new per "TARGET_" variant first:
  std::string includePathVar =
    cmStrCat("CMAKE_", lang, "_TARGET_INCLUDE_PATH");
  cmMakefile* mf = this->LocalGenerator->GetMakefile();
  cmValue includePath = mf->GetDefinition(includePathVar);
  if (includePath) {
    cmExpandList(*includePath, this->IncludePath);
  } else {
    // Fallback to the old directory level variable if no per-target var:
    includePathVar = cmStrCat("CMAKE_", lang, "_INCLUDE_PATH");
    includePath = mf->GetDefinition(includePathVar);
    if (includePath) {
      cmExpandList(*includePath, this->IncludePath);
    }
  }
}